

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_ptr.hpp
# Opt level: O1

value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_nonstd::vptr::detail::default_delete<int>_>
* __thiscall
nonstd::vptr::
value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_nonstd::vptr::detail::default_delete<int>_>
::operator=(value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_nonstd::vptr::detail::default_delete<int>_>
            *this,value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_nonstd::vptr::detail::default_delete<int>_>
                  *rhs)

{
  element_type *v;
  pointer piVar1;
  
  if (this != rhs) {
    v = (rhs->ptr).ptr;
    if (v == (element_type *)0x0) {
      piVar1 = (this->ptr).ptr;
      if (piVar1 != (pointer)0x0) {
        operator_delete(piVar1);
      }
      (this->ptr).ptr = (pointer)0x0;
    }
    else {
      detail::
      compressed_ptr<int,_nonstd::vptr::detail::default_clone<int>,_nonstd::vptr::detail::default_delete<int>_>
      ::reset(&this->ptr,v);
    }
  }
  return this;
}

Assistant:

value_ptr & operator=( value_ptr const & rhs )
    {
        if ( this == &rhs )
            return *this;

        if ( rhs ) ptr.reset( *rhs );
#if nsvp_HAVE_NULLPTR
        else       ptr.reset( nullptr );
#else
        else       ptr.reset( pointer(0) );
#endif
        return *this;
    }